

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permissions.cpp
# Opt level: O0

bool fs_set_permissions(string_view path,int readable,int writable,int executable)

{
  string_view path_00;
  string_view path_01;
  bool bVar1;
  perm_options pVar2;
  error_code eVar3;
  string_view local_100;
  size_t local_f0;
  char *local_e8;
  path local_e0;
  path local_b8;
  path local_90;
  int local_68;
  undefined4 uStack_64;
  error_category *local_60;
  size_t local_58;
  size_t local_50;
  undefined1 local_48 [8];
  error_code ec;
  perms owner_exec;
  perms owner_write;
  perms owner_read;
  int executable_local;
  int writable_local;
  int readable_local;
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  _writable_local = path._M_len;
  ec._M_cat._4_4_ = 0x80;
  ec._M_cat._0_4_ = 0x40;
  std::error_code::error_code((error_code *)local_48);
  local_58 = _writable_local;
  local_50 = path_local._M_len;
  path_01._M_str = (char *)path_local._M_len;
  path_01._M_len = _writable_local;
  bVar1 = fs_exists(path_01);
  if (!bVar1) {
    eVar3 = std::make_error_code(no_such_file_or_directory);
    local_60 = eVar3._M_cat;
    local_68 = eVar3._M_value;
    local_48._4_4_ = uStack_64;
    local_48._0_4_ = local_68;
    ec._0_8_ = local_60;
  }
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_48);
  if ((!bVar1) && (readable != 0)) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_90,(basic_string_view<char,_std::char_traits<char>_> *)&writable_local,
               auto_format);
    pVar2 = remove;
    if (0 < readable) {
      pVar2 = add;
    }
    std::filesystem::permissions(&local_90,owner_read,pVar2,(error_code *)local_48);
    std::filesystem::__cxx11::path::~path(&local_90);
  }
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_48);
  if ((!bVar1) && (writable != 0)) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_b8,(basic_string_view<char,_std::char_traits<char>_> *)&writable_local,
               auto_format);
    pVar2 = remove;
    if (0 < writable) {
      pVar2 = add;
    }
    std::filesystem::permissions(&local_b8,owner_write,pVar2,(error_code *)local_48);
    std::filesystem::__cxx11::path::~path(&local_b8);
  }
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_48);
  if ((!bVar1) && (executable != 0)) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_e0,(basic_string_view<char,_std::char_traits<char>_> *)&writable_local,
               auto_format);
    pVar2 = remove;
    if (0 < executable) {
      pVar2 = add;
    }
    std::filesystem::permissions(&local_e0,owner_exec,pVar2,(error_code *)local_48);
    std::filesystem::__cxx11::path::~path(&local_e0);
  }
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_48);
  if (bVar1) {
    local_f0 = _writable_local;
    local_e8 = (char *)path_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_100,"fs_set_permissions");
    path_00._M_str = local_e8;
    path_00._M_len = local_f0;
    fs_print_error(path_00,local_100,(error_code *)local_48);
  }
  path_local._M_str._7_1_ = !bVar1;
  return path_local._M_str._7_1_;
}

Assistant:

bool fs_set_permissions(std::string_view path, int readable, int writable, int executable)
{
// only sets permission for owner, not group or others

#ifdef HAVE_CXX_FILESYSTEM

#if defined(__cpp_using_enum)  // C++20
  using enum std::filesystem::perms;
#else
  constexpr std::filesystem::perms owner_read = std::filesystem::perms::owner_read;
  constexpr std::filesystem::perms owner_write = std::filesystem::perms::owner_write;
  constexpr std::filesystem::perms owner_exec = std::filesystem::perms::owner_exec;
#endif

  std::error_code ec;
  // need to error if path doesn't exist and no operations are requested
  if(!fs_exists(path))
    ec = std::make_error_code(std::errc::no_such_file_or_directory);

  if (!ec && readable != 0)
    std::filesystem::permissions(path, owner_read,
      (readable > 0) ? std::filesystem::perm_options::add : std::filesystem::perm_options::remove,
      ec);

  if (!ec && writable != 0)
    std::filesystem::permissions(path, owner_write,
      (writable > 0) ? std::filesystem::perm_options::add : std::filesystem::perm_options::remove,
      ec);

  if (!ec && executable != 0)
    std::filesystem::permissions(path, owner_exec,
      (executable > 0) ? std::filesystem::perm_options::add : std::filesystem::perm_options::remove,
      ec);

  if(!ec) FFS_LIKELY
    return true;

  fs_print_error(path, __func__, ec);
  return false;

#else

  int m = fs_st_mode(path);
#ifdef _MSC_VER
  constexpr int r = _S_IREAD;
  constexpr int w = _S_IWRITE;
  constexpr int x = _S_IEXEC;
#else
  constexpr int r = S_IRUSR;
  constexpr int w = S_IWUSR;
  constexpr int x = S_IXUSR;
#endif

  if(readable > 0)
    m |= r;
  else if (readable < 0)
    m &= ~r;

  if(writable > 0)
    m |= w;
  else if (writable < 0)
    m &= ~w;

  if(executable > 0)
    m |= x;
  else if (executable < 0)
    m &= ~x;
// https://learn.microsoft.com/en-us/cpp/c-runtime-library/reference/chmod-wchmod
#ifdef _MSC_VER
  return _chmod(path.data(), m) == 0;
#else
  return chmod(path.data(), m) == 0;
#endif

#endif
}